

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O0

void mxx::impl::scatter_big<std::pair<int,double>>
               (pair<int,_double> *msgs,size_t size,pair<int,_double> *out,int root,comm *comm)

{
  MPI_Datatype poVar1;
  MPI_Datatype poVar2;
  MPI_Comm poVar3;
  datatype local_60;
  undefined1 local_48 [8];
  datatype dt;
  comm *comm_local;
  int root_local;
  pair<int,_double> *out_local;
  size_t size_local;
  pair<int,_double> *msgs_local;
  
  dt._16_8_ = comm;
  get_datatype<std::pair<int,double>>();
  mxx::datatype::contiguous((datatype *)local_48,&local_60,size);
  mxx::datatype::~datatype(&local_60);
  poVar1 = mxx::datatype::type((datatype *)local_48);
  poVar2 = mxx::datatype::type((datatype *)local_48);
  poVar3 = mxx::comm::operator_cast_to_ompi_communicator_t_((comm *)dt._16_8_);
  MPI_Scatter(msgs,1,poVar1,out,1,poVar2,root,poVar3);
  mxx::datatype::~datatype((datatype *)local_48);
  return;
}

Assistant:

void scatter_big(const T* msgs, size_t size, T* out, int root, const mxx::comm& comm = mxx::comm()) {
    mxx::datatype dt = mxx::get_datatype<T>().contiguous(size);
    MPI_Scatter(const_cast<T*>(msgs), 1, dt.type(), out, 1, dt.type(), root, comm);
}